

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  time_t tVar3;
  char otp [13];
  int local_5c;
  time_t local_58;
  undefined8 local_50;
  long local_48;
  char local_3d [13];
  
  iVar1 = getopt(argc,argv,"hl:t:T:");
  if (iVar1 == -1) {
    local_58 = 0;
    if (_optind + 1 != argc) goto LAB_001013ab;
    local_5c = 0x1e;
    uVar2 = 8;
  }
  else {
    uVar2 = 8;
    local_50 = 0;
    local_5c = 0x1e;
    local_48 = 0;
    do {
      switch(iVar1 << 0x1e | iVar1 - 0x54U >> 2) {
      case 0:
        local_5c = atoi(_optarg);
        break;
      default:
        main_cold_1();
        return 1;
      case 5:
        fprintf(_stdout,
                "Usage: %s [-h] [-l length] [-t time] [-T step] <secret>\n  -h          Print this help message and quit\n  -l length   Set the password length. Defaults to %d, max is %d\n  -t time     Set the time. Defaults to current time\n  -T step     Set time step. Defaults to %d\n"
                ,*argv,8,0xc,0x1e);
        return 0;
      case 6:
        uVar2 = atoi(_optarg);
        if (0xc < (int)uVar2) {
          fprintf(_stderr,"Password length %d exceeds maximum of %d",(ulong)uVar2,0xc);
          return 1;
        }
        break;
      case 8:
        local_48 = atol(_optarg);
        local_50 = 1;
      }
      iVar1 = getopt(argc,argv,"hl:t:T:");
    } while (iVar1 != -1);
    local_58 = local_48;
    if (_optind + 1 != argc) {
LAB_001013ab:
      main_cold_2();
      return 1;
    }
    if ((int)local_50 != 0) goto LAB_00101348;
  }
  tVar3 = time(&local_58);
  if (tVar3 == -1) {
    perror("time");
    return -1;
  }
LAB_00101348:
  mtotp_totp(argv[_optind],local_58,local_5c,uVar2,local_3d);
  puts(local_3d);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  time_t now = 0;
  char otp[OTP_MAX_LENGTH + 1];
  int otp_length = OTP_DEFAULT_LENGTH;
  int opt;
  int tfnd = 0;
  int time_step = TIME_STEP_DEFAULT;

  while ((opt = getopt(argc, argv, "hl:t:T:")) != -1) {
    switch (opt) {
    case 'h':
      print_usage(stdout, argv[0]);
      return 0;
    case 'l':
      otp_length = atoi(optarg);
      if (otp_length > OTP_MAX_LENGTH) {
        fprintf(stderr, "Password length %d exceeds maximum of %d", otp_length,
                OTP_MAX_LENGTH);
        return 1;
      }
      break;
    case 't':
      now = atol(optarg);
      tfnd = 1;
      break;
    case 'T':
      time_step = atoi(optarg);
      break;
    default:
      print_usage(stderr, argv[0]);
      return 1;
    }
  }

  if (optind + 1 != argc) {
    print_usage(stderr, argv[0]);
    return 1;
  }

  if (!tfnd && time(&now) == -1) {
    perror("time");
    return -1;
  }

  mtotp_totp(argv[optind], now, time_step, otp_length, otp);
  printf("%s\n", otp);
  return 0;
}